

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::string_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  const_reference pvVar8;
  sel_t *psVar9;
  idx_t iVar10;
  SelectionVector *pSVar11;
  uint uVar12;
  idx_t iVar13;
  idx_t iVar14;
  idx_t iVar15;
  bool bVar16;
  anon_union_16_2_67f50693_for_value local_40;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar4 = rhs_row_locations->data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar8;
      iVar14 = 0;
      iVar15 = 0;
      do {
        iVar13 = iVar15;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar13 = (idx_t)sel->sel_vector[iVar15];
        }
        psVar9 = pSVar3->sel_vector;
        iVar10 = iVar13;
        if (psVar9 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar9[iVar13];
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar4 + iVar13 * 8) + vVar5);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar4 + iVar13 * 8) + (col_idx >> 3))) == 0) ||
           (bVar16 = string_t::operator==
                               ((string_t *)(pdVar2 + iVar10 * 0x10),(string_t *)&local_40.pointer),
           !bVar16)) {
          iVar10 = *no_match_count;
          *no_match_count = iVar10 + 1;
          pSVar11 = no_match_sel;
        }
        else {
          iVar10 = iVar14;
          pSVar11 = sel;
          iVar14 = iVar14 + 1;
        }
        pSVar11->sel_vector[iVar10] = (sel_t)iVar13;
        iVar15 = iVar15 + 1;
      } while (count != iVar15);
      return iVar14;
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    pdVar4 = (lhs_format->unified).data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar8;
      iVar15 = 0;
      iVar14 = 0;
      do {
        psVar9 = sel->sel_vector;
        iVar13 = iVar14;
        if (psVar9 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar9[iVar14];
        }
        psVar6 = pSVar3->sel_vector;
        iVar10 = iVar13;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar13];
        }
        puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          bVar16 = false;
        }
        else {
          bVar16 = (puVar7[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0;
        }
        uVar12 = (uint)*(byte *)(*(long *)(pdVar2 + iVar13 * 8) + (col_idx >> 3)) &
                 1 << ((byte)col_idx & 7);
        puVar1 = (undefined8 *)(*(long *)(pdVar2 + iVar13 * 8) + vVar5);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if ((bVar16 == false) && (uVar12 != 0)) {
          bVar16 = string_t::operator==
                             ((string_t *)(pdVar4 + iVar10 * 0x10),(string_t *)&local_40.pointer);
          if (bVar16) {
            psVar9 = sel->sel_vector;
            goto LAB_00ae00e9;
          }
LAB_00ae00c7:
          iVar10 = *no_match_count;
          *no_match_count = iVar10 + 1;
          no_match_sel->sel_vector[iVar10] = (sel_t)iVar13;
        }
        else {
          if (bVar16 != (uVar12 == 0)) goto LAB_00ae00c7;
LAB_00ae00e9:
          psVar9[iVar15] = (sel_t)iVar13;
          iVar15 = iVar15 + 1;
        }
        iVar14 = iVar14 + 1;
        if (count == iVar14) {
          return iVar15;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}